

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::addSwitchBreak(Builder *this,bool implicit)

{
  _Elt_pointer ppBVar1;
  char *pcVar2;
  
  ppBVar1 = (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar1 ==
      (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppBVar1 = (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pcVar2 = (char *)(ulong)implicit;
  createBranch(this,implicit,ppBVar1[-1]);
  createAndSetNoPredecessorBlock(this,pcVar2);
  return;
}

Assistant:

void Builder::addSwitchBreak(bool implicit)
{
    // branch to the top of the merge block stack
    createBranch(implicit, switchMerges.top());
    createAndSetNoPredecessorBlock("post-switch-break");
}